

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O1

MPP_RET mpp_packet_add_segment_info(MppPacket packet,RK_S32 type,RK_S32 offset,RK_S32 len)

{
  size_t size;
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = *(uint *)((long)packet + 0x58);
  uVar6 = (ulong)uVar3;
  if (uVar3 < *(uint *)((long)packet + 0x5c)) {
    pvVar4 = *(void **)((long)packet + 0x128);
    if (pvVar4 == (void *)0x0) {
      pvVar4 = (void *)((long)packet + 0x60);
      *(void **)((long)packet + 0x128) = pvVar4;
    }
  }
  else {
    uVar2 = *(uint *)((long)packet + 0x5c) * 2;
    size = (ulong)uVar2 * 0x18;
    if (*(void **)((long)packet + 0x120) == (void *)0x0) {
      pvVar4 = mpp_osal_calloc("mpp_packet_add_segment_info",size);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        memcpy(pvVar4,(void *)((long)packet + 0x60),0xc0);
      }
    }
    else {
      pvVar4 = mpp_osal_realloc("mpp_packet_add_segment_info",*(void **)((long)packet + 0x120),size)
      ;
    }
    if (pvVar4 == (void *)0x0) {
      return MPP_NOK;
    }
    if (uVar3 - 1 != 0) {
      uVar5 = (ulong)(uVar3 - 1);
      pvVar1 = pvVar4;
      do {
        *(void **)((long)pvVar1 + 0x10) = (void *)((long)pvVar1 + 0x18);
        uVar5 = uVar5 - 1;
        pvVar1 = (void *)((long)pvVar1 + 0x18);
      } while (uVar5 != 0);
    }
    *(void **)((long)packet + 0x120) = pvVar4;
    *(void **)((long)packet + 0x128) = pvVar4;
    *(uint *)((long)packet + 0x5c) = uVar2;
    if (pvVar4 == (void *)0x0) {
      return MPP_NOK;
    }
  }
  *(uint *)((long)pvVar4 + uVar6 * 0x18) = uVar3;
  *(RK_S32 *)((long)pvVar4 + uVar6 * 0x18 + 4) = type;
  *(RK_S32 *)((long)pvVar4 + uVar6 * 0x18 + 8) = offset;
  *(RK_S32 *)((long)pvVar4 + uVar6 * 0x18 + 0xc) = len;
  *(undefined8 *)((long)pvVar4 + uVar6 * 0x18 + 0x10) = 0;
  if (uVar3 != 0) {
    pvVar4 = (void *)((long)pvVar4 + uVar6 * 0x18);
    *(void **)((long)pvVar4 + -8) = pvVar4;
  }
  uVar3 = *(int *)((long)packet + 0x58) + 1;
  *(uint *)((long)packet + 0x58) = uVar3;
  if ((*(uint *)((long)packet + 0x5c) < uVar3) &&
     (_mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "p->segment_nb <= p->segment_buf_cnt","mpp_packet_add_segment_info",0x22b),
     (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_packet_add_segment_info(MppPacket packet, RK_S32 type, RK_S32 offset, RK_S32 len)
{
    MppPacketImpl *p = (MppPacketImpl *)packet;
    RK_U32 old_buf_cnt = p->segment_buf_cnt;
    RK_U32 segment_nb  = p->segment_nb;
    MppPktSeg *seg_buf = p->segments;

    if (segment_nb >= old_buf_cnt) {
        RK_U32 i;

        /* realloc segment info buffer. default 8 segments */
        old_buf_cnt *= 2;

        if (NULL == p->segments_ext) {
            seg_buf = mpp_calloc(MppPktSeg, old_buf_cnt);
            if (seg_buf)
                memcpy(seg_buf, p->segments_def, sizeof(p->segments_def));
        } else {
            seg_buf = mpp_realloc(p->segments_ext, MppPktSeg, old_buf_cnt);
        }

        if (NULL == seg_buf)
            return MPP_NOK;

        for (i = 0; i < segment_nb - 1; i++)
            seg_buf[i].next = &seg_buf[i + 1];

        p->segments_ext = seg_buf;
        p->segments = seg_buf;
        p->segment_buf_cnt = old_buf_cnt;
    } else {
        if (NULL == seg_buf) {
            seg_buf = p->segments_def;
            p->segments = seg_buf;
        }
    }

    mpp_assert(seg_buf);
    seg_buf += segment_nb;
    seg_buf->index  = segment_nb;
    seg_buf->type   = type;
    seg_buf->offset = offset;
    seg_buf->len    = len;
    seg_buf->next   = NULL;

    if (segment_nb)
        seg_buf[-1].next = seg_buf;

    p->segment_nb++;
    mpp_assert(p->segment_nb <= p->segment_buf_cnt);

    return MPP_OK;
}